

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O3

void __thiscall wasm::EffectAnalyzer::InternalAnalyzer::visitLoop(InternalAnalyzer *this,Loop *curr)

{
  EffectAnalyzer *pEVar1;
  size_t sVar2;
  pair<std::_Rb_tree_iterator<wasm::Name>,_std::_Rb_tree_iterator<wasm::Name>_> pVar3;
  
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    pEVar1 = this->parent;
    pVar3 = std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::equal_range(&(pEVar1->breakTargets)._M_t,&curr->name);
    sVar2 = (pEVar1->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_M_erase_aux(&(pEVar1->breakTargets)._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
    if (sVar2 != (pEVar1->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      this->parent->mayNotReturn = true;
    }
  }
  return;
}

Assistant:

explicit operator bool() const { return str.data() != nullptr; }